

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# devextra.c
# Opt level: O0

void area_echo(CHAR_DATA *ch,char *echo)

{
  long in_RDI;
  DESCRIPTOR_DATA *d;
  char buffer [9216];
  DESCRIPTOR_DATA *local_2420;
  CHAR_DATA *in_stack_ffffffffffffdbe8;
  CHAR_DATA *in_stack_ffffffffffffdbf0;
  char *in_stack_ffffffffffffdbf8;
  char *in_stack_ffffffffffffdc00;
  
  for (local_2420 = descriptor_list; local_2420 != (DESCRIPTOR_DATA *)0x0;
      local_2420 = local_2420->next) {
    if ((((local_2420->connected == 0) && (local_2420->character->in_room != (ROOM_INDEX_DATA *)0x0)
         ) && (*(long *)(in_RDI + 0xa8) != 0)) &&
       (local_2420->character->in_room->area ==
        *(AREA_DATA_conflict **)(*(long *)(in_RDI + 0xa8) + 0x30))) {
      colorconv(in_stack_ffffffffffffdc00,in_stack_ffffffffffffdbf8,in_stack_ffffffffffffdbf0);
      send_to_char((char *)in_stack_ffffffffffffdbf0,in_stack_ffffffffffffdbe8);
      send_to_char((char *)in_stack_ffffffffffffdbf0,in_stack_ffffffffffffdbe8);
    }
  }
  return;
}

Assistant:

void area_echo(CHAR_DATA *ch, char *echo)
{
	char buffer[MAX_STRING_LENGTH * 2];

	for (DESCRIPTOR_DATA *d = descriptor_list; d; d = d->next)
	{
		if (d->connected == CON_PLAYING
			&& d->character->in_room != nullptr
			&& ch->in_room != nullptr
			&& d->character->in_room->area == ch->in_room->area)
		{
			colorconv(buffer, echo, d->character);
			send_to_char(buffer, d->character);
			send_to_char("\n\r", d->character);
		}
	}
}